

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

void cleanupListExtras(atom *alst,xformDatabase *xdb,abrAtomListProc *delAtomProc,void *deletestuff)

{
  atom_t **ppaVar1;
  atom_t *paVar2;
  transformData *ptVar3;
  xformAtomRecords *pxVar4;
  atom *paVar5;
  
  paVar2 = alst;
  if (xdb != (xformDatabase *)0x0 && alst != (atom *)0x0) {
    do {
      paVar2->mark = 1;
      ppaVar1 = &paVar2->next;
      paVar2 = *ppaVar1;
    } while (*ppaVar1 != (atom_t *)0x0);
    for (ptVar3 = xdb->xforms; ptVar3 != (transformData *)0x0; ptVar3 = ptVar3->next) {
      for (pxVar4 = ptVar3->recs; pxVar4 != (xformAtomRecords *)0x0; pxVar4 = pxVar4->next) {
        pxVar4->a->mark = 0;
      }
    }
    paVar5 = (atom *)0x0;
    do {
      paVar2 = alst->next;
      if (alst->mark != 0) {
        (*delAtomProc)(alst,deletestuff);
        if (paVar5 == (atom *)0x0) {
          alst = (atom *)0x0;
        }
        else {
          paVar5->next = paVar2;
          alst = paVar5;
        }
      }
      paVar5 = alst;
      alst = paVar2;
    } while (paVar2 != (atom_t *)0x0);
  }
  return;
}

Assistant:

void cleanupListExtras(atom *alst, xformDatabase* xdb,
            abrAtomListProc delAtomProc, void *deletestuff) {

   atom *a = NULL, *prev= NULL, *next = NULL;
   transformData *xform = NULL;
   xformAtomRecords *xa = NULL;

   if (alst && xdb) {
      /* mark everything in the atom list */
      for(a = alst; a; a = a->next) {
	 a->mark = 1;
      }

      /* unmark atoms reachable from the transformation database */
      for(xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    xa->a->mark = 0;
	 }
      }

      /* if still marked - must be extra - delete it */
      prev = NULL;
      for(a = alst; a; a = next) {
	 next = a->next;
	 if (a->mark) {
	    delAtomProc(a, deletestuff);
	    if (prev) { prev->next = next; }
	 }
	 else { prev = a; }
      }
   }
}